

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_integer(qpdf_data qpdf,longlong value)

{
  longlong qpdf_00;
  qpdf_oh qVar1;
  QPDFObjectHandle local_28;
  longlong local_18;
  longlong value_local;
  qpdf_data qpdf_local;
  
  local_18 = value;
  value_local = (longlong)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_integer",0);
  qpdf_00 = value_local;
  QPDFObjectHandle::newInteger(&local_28,local_18);
  qVar1 = new_object((qpdf_data)qpdf_00,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_integer(qpdf_data qpdf, long long value)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_integer");
    return new_object(qpdf, QPDFObjectHandle::newInteger(value));
}